

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O3

void * __thiscall asmjit::Zone::_alloc(Zone *this,size_t size)

{
  Block *pBVar1;
  ulong uVar2;
  int iVar3;
  Block *pBVar4;
  uint8_t *puVar5;
  undefined4 extraout_var;
  void *extraout_RAX;
  size_t __n;
  long lVar7;
  void *pvVar8;
  char cVar9;
  Block *pBVar10;
  uint8_t *size_00;
  uint8_t *puVar11;
  ulong uVar12;
  void *pvVar6;
  
  uVar12 = (ulong)this->_blockSize;
  if (this->_blockSize <= size) {
    uVar12 = size;
  }
  lVar7 = 1L << ((byte)this->_blockAlignmentShift & 0x3f);
  pBVar10 = this->_block;
  if ((pBVar10 == (Block *)Zone_zeroBlock) || ((ulong)((long)this->_end - (long)this->_ptr) < size))
  {
    pBVar1 = pBVar10->next;
    if ((pBVar1 == (Block *)0x0) || (uVar2 = pBVar1->size, uVar2 < size)) {
      if ((-lVar7 - 0x21U < uVar12) ||
         (pBVar4 = (Block *)malloc(uVar12 + lVar7 + 0x20), pBVar4 == (Block *)0x0)) {
        return (void *)0x0;
      }
      pvVar8 = (void *)(-lVar7 & (ulong)(pBVar4->data + lVar7 + -1));
      pBVar4->prev = (Block *)0x0;
      pBVar4->next = (Block *)0x0;
      pBVar4->size = uVar12 + lVar7;
      if (pBVar10 != (Block *)Zone_zeroBlock) {
        pBVar4->prev = pBVar10;
        pBVar10->next = pBVar4;
        if (pBVar1 != (Block *)0x0) {
          pBVar4->next = pBVar1;
          pBVar1->prev = pBVar4;
        }
      }
      this->_block = pBVar4;
      this->_ptr = (uint8_t *)(size + (long)pvVar8);
      puVar11 = pBVar4->data + uVar12 + lVar7;
    }
    else {
      pvVar8 = (void *)(-lVar7 & (ulong)(pBVar1->data + lVar7 + -1));
      this->_block = pBVar1;
      this->_ptr = (uint8_t *)(size + (long)pvVar8);
      puVar11 = pBVar1->data + uVar2;
    }
    this->_end = puVar11;
    return pvVar8;
  }
  size_00 = (uint8_t *)size;
  _alloc();
  puVar11 = this->_ptr;
  if (this->_end + -(long)puVar11 < size_00) {
    puVar11 = (uint8_t *)_alloc(this,(size_t)size_00);
LAB_0011862f:
    if (puVar11 != (uint8_t *)0x0) {
      memset(puVar11,0,(size_t)size_00);
    }
    return puVar11;
  }
  puVar5 = puVar11 + (long)size_00;
  this->_ptr = puVar5;
  if (puVar5 <= this->_end) goto LAB_0011862f;
  allocZeroed();
  if (size_00 == (uint8_t *)0x0) {
    return (void *)0x0;
  }
  if (__n == 0) {
    return (void *)0x0;
  }
  if (__n == 0xffffffffffffffff) {
    dup((int)this);
    puVar11 = size_00;
  }
  else {
    pBVar10 = (Block *)((ulong)puVar5 & 0xffffffff);
    cVar9 = (char)pBVar10;
    puVar11 = (uint8_t *)(((ulong)puVar5 & 0xff) + __n);
    puVar5 = this->_ptr;
    size = (size_t)size_00;
    if (puVar11 <= this->_end + -(long)puVar5) {
      puVar11 = puVar11 + (long)puVar5;
      this->_ptr = puVar11;
      if (this->_end < puVar11) {
        iVar3 = dup((int)this);
        pvVar6 = (void *)CONCAT44(extraout_var,iVar3);
        pvVar8 = *(void **)&this[2]._blockSize;
        while (pvVar8 != (void *)0x0) {
          pvVar6 = *(void **)((long)pvVar8 + 8);
          free(pvVar8);
          pvVar8 = pvVar6;
          pvVar6 = extraout_RAX;
        }
        this[2]._end = (uint8_t *)0x0;
        this[2]._block = (Block *)0x0;
        this[1]._blockSize = 0;
        this[1]._blockAlignmentShift = 0;
        this[2]._ptr = (uint8_t *)0x0;
        this[1]._end = (uint8_t *)0x0;
        this[1]._block = (Block *)0x0;
        this->_blockSize = 0;
        this->_blockAlignmentShift = 0;
        this[1]._ptr = (uint8_t *)0x0;
        this->_end = (uint8_t *)0x0;
        this->_block = (Block *)0x0;
        this[2]._blockSize = 0;
        this[2]._blockAlignmentShift = 0;
        this->_ptr = puVar11;
        return pvVar6;
      }
      goto LAB_001186a4;
    }
  }
  cVar9 = (char)pBVar10;
  puVar5 = (uint8_t *)_alloc(this,(size_t)puVar11);
LAB_001186a4:
  if (puVar5 == (uint8_t *)0x0) {
    puVar5 = (uint8_t *)0x0;
  }
  else {
    memcpy(puVar5,(void *)size,__n);
    if (cVar9 != '\0') {
      puVar5[__n] = '\0';
    }
  }
  return puVar5;
}

Assistant:

void* Zone::_alloc(size_t size) noexcept {
  Block* curBlock = _block;
  uint8_t* p;

  size_t blockSize = std::max<size_t>(_blockSize, size);
  size_t blockAlignment = getBlockAlignment();

  // The `_alloc()` method can only be called if there is not enough space
  // in the current block, see `alloc()` implementation for more details.
  ASMJIT_ASSERT(curBlock == &Zone_zeroBlock || getRemainingSize() < size);

  // If the `Zone` has been cleared the current block doesn't have to be the
  // last one. Check if there is a block that can be used instead of allocating
  // a new one. If there is a `next` block it's completely unused, we don't have
  // to check for remaining bytes.
  Block* next = curBlock->next;
  if (next && next->size >= size) {
    p = Utils::alignTo(next->data, blockAlignment);

    _block = next;
    _ptr = p + size;
    _end = next->data + next->size;

    return static_cast<void*>(p);
  }

  // Prevent arithmetic overflow.
  if (ASMJIT_UNLIKELY(blockSize > (~static_cast<size_t>(0) - sizeof(Block) - blockAlignment)))
    return nullptr;

  blockSize += blockAlignment;
  Block* newBlock = static_cast<Block*>(Internal::allocMemory(sizeof(Block) + blockSize));

  if (ASMJIT_UNLIKELY(!newBlock))
    return nullptr;

  // Align the pointer to `blockAlignment` and adjust the size of this block
  // accordingly. It's the same as using `blockAlignment - Utils::alignDiff()`,
  // just written differently.
  p = Utils::alignTo(newBlock->data, blockAlignment);
  newBlock->prev = nullptr;
  newBlock->next = nullptr;
  newBlock->size = blockSize;

  if (curBlock != &Zone_zeroBlock) {
    newBlock->prev = curBlock;
    curBlock->next = newBlock;

    // Does only happen if there is a next block, but the requested memory
    // can't fit into it. In this case a new buffer is allocated and inserted
    // between the current block and the next one.
    if (next) {
      newBlock->next = next;
      next->prev = newBlock;
    }
  }

  _block = newBlock;
  _ptr = p + size;
  _end = newBlock->data + blockSize;

  return static_cast<void*>(p);
}